

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::inspectActiveSubroutineUniformName
          (FunctionalTest3_4 *this,GLuint program_id,GLchar **uniform_names)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLint n_active_subroutine_uniforms;
  vector<char,_std::allocator<char>_> active_uniform_name;
  vector<char,_std::allocator<char>_> local_1d8;
  long local_1b8;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (**(code **)(lVar2 + 0x9d0))(program_id,0x8b31,0x8de6);
  err = (**(code **)(lVar2 + 0x800))();
  glu::checkError(err,"GetProgramStageiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xdc5);
  std::vector<char,_std::allocator<char>_>::resize
            (&local_1d8,(long)(this->m_n_active_subroutine_uniform_name_length + 1));
  if (local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    local_1b8 = lVar2;
    operator_delete(local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool FunctionalTest3_4::inspectActiveSubroutineUniformName(GLuint program_id, const GLchar** uniform_names) const
{
	const glw::Functions& gl						   = m_context.getRenderContext().getFunctions();
	bool				  result					   = true;
	GLint				  n_active_subroutine_uniforms = 0;
	std::vector<GLchar>   active_uniform_name;

	gl.getProgramStageiv(program_id, GL_VERTEX_SHADER, GL_ACTIVE_SUBROUTINE_UNIFORMS, &n_active_subroutine_uniforms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramStageiv");

	active_uniform_name.resize(m_n_active_subroutine_uniform_name_length + 1);

	for (GLint uniform = 0; uniform < n_active_subroutine_uniforms; ++uniform)
	{
		bool is_name_ok = false;

		gl.getActiveSubroutineUniformName(program_id, GL_VERTEX_SHADER, uniform, (GLsizei)active_uniform_name.size(),
										  0 /* length */, &active_uniform_name[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveSubroutineUniformName");

		for (GLint name = 0; name < n_active_subroutine_uniforms; ++name)
		{
			if (0 == strcmp(uniform_names[name], &active_uniform_name[0]))
			{
				is_name_ok = true;
				break;
			}
		}

		if (false == is_name_ok)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "Error. Invalid result. Function: getActiveSubroutineUniformName. idnex: " << uniform
				<< ". Result: " << &active_uniform_name[0] << tcu::TestLog::EndMessage;

			result = false;
			break;
		}
	}

	return result;
}